

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void load_replay_kvs(storage_t *st,fdb_kvs_handle *replay_kvs,fdb_seqnum_t seqnum)

{
  size_t *psVar1;
  size_t keylen;
  size_t keylen_00;
  short sVar2;
  fdb_status fVar3;
  size_t seek_keylen;
  int iVar4;
  ulong unaff_RBP;
  fdb_kvs_handle *pfVar5;
  fdb_kvs_handle *handle;
  uint uVar6;
  void *unaff_R12;
  char *unaff_R13;
  fdb_config *fconfig;
  bool bVar7;
  fdb_doc *rdoc;
  fdb_iterator *it;
  timeval __test_begin;
  fdb_file_handle *pfStackY_10a8;
  fdb_doc **ppfStackY_10a0;
  fdb_kvs_handle *pfStack_1090;
  fdb_doc *pfStack_1088;
  fdb_kvs_handle *pfStack_1080;
  fdb_kvs_handle *pfStack_1078;
  fdb_file_handle *pfStack_1070;
  fdb_kvs_config fStack_1068;
  timeval tStack_1050;
  person_t pStack_103c;
  fdb_kvs_handle *pfStack_230;
  void *pvStack_228;
  char *pcStack_220;
  fdb_config *pfStack_218;
  storage_t *psStack_210;
  code *pcStack_208;
  undefined1 auStack_1f8 [24];
  fdb_kvs_handle *pfStack_1e0;
  fdb_kvs_handle *pfStack_1d8;
  char acStack_1ca [10];
  size_t sStack_1c0;
  fdb_kvs_config fStack_1b8;
  timeval tStack_1a0;
  fdb_kvs_info fStack_190;
  fdb_config fStack_160;
  fdb_kvs_handle *pfStack_68;
  fdb_doc *local_38;
  fdb_kvs_handle *local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_38 = (fdb_doc *)0x0;
  pfVar5 = st->rtx;
  fVar3 = fdb_iterator_sequence_init(pfVar5,(fdb_iterator **)&local_30,0,seqnum,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    while (pfVar5 = local_30, fVar3 = fdb_iterator_get((fdb_iterator *)local_30,&local_38),
          fVar3 == FDB_RESULT_SUCCESS) {
      st = (storage_t *)local_38->body;
      sVar2 = *(short *)&st[0xd].main;
      if (sVar2 == 1) {
        keylen._0_1_ = st[0xc].keyspace[0];
        keylen._1_1_ = st[0xc].keyspace[1];
        keylen._2_1_ = st[0xc].keyspace[2];
        keylen._3_1_ = st[0xc].keyspace[3];
        keylen._4_1_ = st[0xc].keyspace[4];
        keylen._5_1_ = st[0xc].keyspace[5];
        keylen._6_1_ = st[0xc].walflush;
        keylen._7_1_ = st[0xc].verify_set;
        pfVar5 = replay_kvs;
        fVar3 = fdb_set_kv(replay_kvs,(void *)((long)&st->main + 4),keylen,(void *)0x0,0);
        if (fVar3 == FDB_RESULT_SUCCESS) {
          sVar2 = *(short *)&st[0xd].main;
          goto LAB_001071ba;
        }
        goto LAB_0010721c;
      }
LAB_001071ba:
      if (sVar2 == 2) {
        keylen_00._0_1_ = st[0xc].keyspace[0];
        keylen_00._1_1_ = st[0xc].keyspace[1];
        keylen_00._2_1_ = st[0xc].keyspace[2];
        keylen_00._3_1_ = st[0xc].keyspace[3];
        keylen_00._4_1_ = st[0xc].keyspace[4];
        keylen_00._5_1_ = st[0xc].keyspace[5];
        keylen_00._6_1_ = st[0xc].walflush;
        keylen_00._7_1_ = st[0xc].verify_set;
        st = (storage_t *)((long)&st->main + 4);
        pfVar5 = replay_kvs;
        fVar3 = fdb_del_kv(replay_kvs,st,keylen_00);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00107217;
      }
      fdb_doc_free(local_38);
      local_38 = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next((fdb_iterator *)local_30);
      if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
        fdb_iterator_close((fdb_iterator *)local_30);
        return;
      }
    }
    load_replay_kvs();
LAB_00107217:
    load_replay_kvs();
LAB_0010721c:
    load_replay_kvs();
  }
  load_replay_kvs();
  pcStack_208 = (code *)0x107246;
  pfStack_68 = replay_kvs;
  gettimeofday(&tStack_1a0,(__timezone_ptr_t)0x0);
  fconfig = &fStack_160;
  pcStack_208 = (code *)0x107256;
  fdb_get_default_config();
  pcStack_208 = (code *)0x107260;
  fdb_get_default_kvs_config();
  fStack_160.wal_threshold = 0x400;
  fStack_160.flags = 1;
  fStack_160.seqtree_opt = '\x01';
  fStack_160.compaction_threshold = '\n';
  auStack_1f8._0_8_ = (fdb_doc *)0x0;
  handle = (fdb_kvs_handle *)(auStack_1f8 + 0x10);
  pcStack_208 = (code *)0x107297;
  fVar3 = fdb_open((fdb_file_handle **)handle,"e2edb_records",fconfig);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_208 = (code *)0x1072ab;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar5->kvs_config,*(bool *)((long)&pfVar5->file + 6));
    handle = (fdb_kvs_handle *)(pfVar5->kvs_config).custom_cmp;
    pcStack_208 = (code *)0x1072b9;
    fVar3 = fdb_get_kvs_info(handle,&fStack_190);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)pfVar5->fhandle;
      pcStack_208 = (code *)0x1072d6;
      fVar3 = fdb_iterator_sequence_init(handle,(fdb_iterator **)(auStack_1f8 + 8),0,0,0);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fconfig = (fdb_config *)&(pfVar5->kvs_config).custom_cmp;
        do {
          pcStack_208 = (code *)0x1072ec;
          fVar3 = fdb_iterator_next((fdb_iterator *)auStack_1f8._8_8_);
        } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
        pcStack_208 = (code *)0x1072fb;
        fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_1f8._8_8_);
        if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
          st = (storage_t *)auStack_1f8;
          unaff_R13 = acStack_1ca;
          unaff_RBP = 0;
          do {
            pcStack_208 = (code *)0x10731d;
            handle = (fdb_kvs_handle *)auStack_1f8._8_8_;
            fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1f8._8_8_,(fdb_doc **)st);
            if (fVar3 != FDB_RESULT_SUCCESS) {
              pcStack_208 = (code *)0x1074ca;
              replay();
LAB_001074ca:
              pcStack_208 = (code *)0x1074cf;
              replay();
LAB_001074cf:
              pcStack_208 = (code *)0x1074d4;
              replay();
LAB_001074d4:
              pcStack_208 = (code *)0x1074d9;
              replay();
LAB_001074d9:
              pcStack_208 = (code *)0x1074de;
              replay();
LAB_001074de:
              pcStack_208 = (code *)0x1074e3;
              replay();
LAB_001074e3:
              pcStack_208 = (code *)0x1074e8;
              replay();
              goto LAB_001074e8;
            }
            unaff_R12 = *(void **)(auStack_1f8._0_8_ + 0x40);
            if (*(short *)((long)unaff_R12 + 0x410) == 6) {
              pcStack_208 = (code *)0x107351;
              sprintf(unaff_R13,"rkvs%d",unaff_RBP);
              pcStack_208 = (code *)0x107368;
              handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
              fVar3 = fdb_kvs_open((fdb_file_handle *)auStack_1f8._16_8_,&pfStack_1d8,unaff_R13,
                                   &fStack_1b8);
              if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001074ca;
              pcStack_208 = (code *)0x107386;
              load_replay_kvs((storage_t *)pfVar5,pfStack_1d8,
                              *(fdb_seqnum_t *)(auStack_1f8._0_8_ + 0x28));
              handle = (fdb_kvs_handle *)pfVar5->trie;
              psVar1 = (size_t *)((long)unaff_R12 + 0x408);
              unaff_R12 = (void *)((long)unaff_R12 + 4);
              pcStack_208 = (code *)0x1073a8;
              fVar3 = fdb_get_kv(handle,unaff_R12,*psVar1,&pfStack_1e0,&sStack_1c0);
              if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001074cf;
              pcStack_208 = (code *)0x1073c4;
              handle = (fdb_kvs_handle *)fconfig;
              fVar3 = fdb_rollback((fdb_kvs_handle **)fconfig,
                                   *(fdb_seqnum_t *)&pfStack_1e0[2].kvs_config);
              if (fVar3 == FDB_RESULT_SUCCESS) {
                pcStack_208 = (code *)0x1073d6;
                free(pfStack_1e0);
                pfStack_1e0 = (fdb_kvs_handle *)0x0;
                pcStack_208 = (code *)0x1073ec;
                e2e_fdb_commit(*(fdb_file_handle **)&pfVar5->kvs_config,true);
                handle = (fdb_kvs_handle *)pfVar5->fhandle;
                pcStack_208 = (code *)0x1073fa;
                fVar3 = fdb_get_kvs_info(handle,&fStack_190);
                if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001074d9;
                pcStack_208 = (code *)0x107410;
                e2e_fdb_commit((fdb_file_handle *)auStack_1f8._16_8_,
                               *(bool *)((long)&pfVar5->file + 6));
                pcStack_208 = (code *)0x10741e;
                db_compare((fdb_kvs_handle *)(pfVar5->kvs_config).custom_cmp,pfStack_1d8);
                pcStack_208 = (code *)0x107428;
                handle = pfStack_1d8;
                fVar3 = fdb_kvs_close(pfStack_1d8);
                if (fVar3 == FDB_RESULT_SUCCESS) {
                  pcStack_208 = (code *)0x10743d;
                  handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
                  fVar3 = fdb_kvs_remove((fdb_file_handle *)auStack_1f8._16_8_,unaff_R13);
                  if (fVar3 == FDB_RESULT_SUCCESS) {
                    unaff_RBP = (ulong)((int)unaff_RBP + 1);
                    goto LAB_0010744c;
                  }
                  goto LAB_001074d4;
                }
                goto LAB_001074de;
              }
              if (fVar3 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001074e3;
              pcStack_208 = (code *)0x10747e;
              free(pfStack_1e0);
              pcStack_208 = (code *)0x107488;
              fVar3 = fdb_kvs_close(pfStack_1d8);
              handle = pfStack_1d8;
              if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001074f7;
              pcStack_208 = (code *)0x10749b;
              handle = (fdb_kvs_handle *)auStack_1f8._16_8_;
              fVar3 = fdb_kvs_remove((fdb_file_handle *)auStack_1f8._16_8_,acStack_1ca);
              if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001074fc;
              break;
            }
LAB_0010744c:
            pcStack_208 = (code *)0x107451;
            fdb_doc_free((fdb_doc *)auStack_1f8._0_8_);
            auStack_1f8._0_8_ = (fdb_doc *)0x0;
            pcStack_208 = (code *)0x107464;
            fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_1f8._8_8_);
          } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
        }
        pcStack_208 = (code *)0x1074a9;
        fdb_iterator_close((fdb_iterator *)auStack_1f8._8_8_);
        pcStack_208 = (code *)0x1074b3;
        fdb_close((fdb_file_handle *)auStack_1f8._16_8_);
        return;
      }
      goto LAB_001074f2;
    }
  }
  else {
LAB_001074e8:
    pcStack_208 = (code *)0x1074ed;
    replay();
  }
  pcStack_208 = (code *)0x1074f2;
  replay();
LAB_001074f2:
  pcStack_208 = (code *)0x1074f7;
  replay();
LAB_001074f7:
  pcStack_208 = (code *)0x1074fc;
  replay();
LAB_001074fc:
  pcStack_208 = iterate_thread;
  replay();
  uVar6 = 0;
  ppfStackY_10a0 = (fdb_doc **)0x107524;
  pfStack_230 = pfVar5;
  pvStack_228 = unaff_R12;
  pcStack_220 = unaff_R13;
  pfStack_218 = fconfig;
  psStack_210 = st;
  pcStack_208 = (code *)unaff_RBP;
  gettimeofday(&tStack_1050,(__timezone_ptr_t)0x0);
  pfStack_1088 = (fdb_doc *)0x0;
  ppfStackY_10a0 = (fdb_doc **)0x107544;
  fdb_open(&pfStack_1070,"e2edb_main",(fdb_config *)handle);
  ppfStackY_10a0 = (fdb_doc **)0x10754e;
  fdb_get_default_kvs_config();
LAB_00107558:
  ppfStackY_10a0 = (fdb_doc **)0x107573;
  fdb_kvs_open(pfStack_1070,&pfStack_1078,"e2ekv_alldocs",&fStack_1068);
  pfVar5 = pfStack_1078;
  if ((uVar6 & 1) == 0) {
    ppfStackY_10a0 = (fdb_doc **)0x10758f;
    fVar3 = fdb_snapshot_open(pfStack_1078,&pfStack_1080,0xffffffffffffffff);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfStackY_10a0 = (fdb_doc **)0x1075b5;
      pfVar5 = pfStack_1080;
      fVar3 = fdb_iterator_init(pfStack_1080,(fdb_iterator **)&pfStack_1090,(void *)0x0,0,
                                (void *)0x0,0,0);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_001075df;
    }
    else {
LAB_001076f9:
      ppfStackY_10a0 = (fdb_doc **)0x1076fe;
      iterate_thread();
    }
    ppfStackY_10a0 = (fdb_doc **)0x107703;
    iterate_thread();
  }
  else {
    ppfStackY_10a0 = (fdb_doc **)0x1075d7;
    fVar3 = fdb_iterator_init(pfStack_1078,(fdb_iterator **)&pfStack_1090,(void *)0x0,0,(void *)0x0,
                              0,0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
LAB_001075df:
      iVar4 = 0;
      do {
        ppfStackY_10a0 = (fdb_doc **)0x1075ef;
        pfVar5 = pfStack_1090;
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1090,&pfStack_1088);
        bVar7 = iVar4 != 0;
        iVar4 = iVar4 + -1;
        if ((bVar7) && (fVar3 != FDB_RESULT_SUCCESS)) goto LAB_001076f4;
        ppfStackY_10a0 = (fdb_doc **)0x107607;
        fdb_doc_free(pfStack_1088);
        pfStack_1088 = (fdb_doc *)0x0;
        ppfStackY_10a0 = (fdb_doc **)0x10761a;
        fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1090);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      iVar4 = 0;
LAB_00107622:
      while( true ) {
        ppfStackY_10a0 = (fdb_doc **)0x10762c;
        fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_1090);
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0010765b;
        ppfStackY_10a0 = (fdb_doc **)0x10763e;
        pfVar5 = pfStack_1090;
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1090,&pfStack_1088);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        ppfStackY_10a0 = (fdb_doc **)0x107650;
        fdb_doc_free(pfStack_1088);
        pfStack_1088 = (fdb_doc *)0x0;
      }
      ppfStackY_10a0 = (fdb_doc **)0x1076f4;
      iterate_thread();
LAB_001076f4:
      ppfStackY_10a0 = (fdb_doc **)0x1076f9;
      iterate_thread();
      goto LAB_001076f9;
    }
  }
  ppfStackY_10a0 = (fdb_doc **)compact_thread;
  iterate_thread();
  ppfStackY_10a0 = &pfStack_1088;
  fdb_open(&pfStackY_10a8,"e2edb_main",(fdb_config *)pfVar5);
  iVar4 = 3;
  do {
    sleep(2);
    fdb_compact(pfStackY_10a8,(char *)0x0);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  fdb_close(pfStackY_10a8);
  return;
LAB_0010765b:
  ppfStackY_10a0 = (fdb_doc **)0x107663;
  gen_person(&pStack_103c);
  pfVar5 = pfStack_1090;
  ppfStackY_10a0 = (fdb_doc **)0x107670;
  seek_keylen = strlen(pStack_103c.key);
  ppfStackY_10a0 = (fdb_doc **)0x107684;
  fdb_iterator_seek((fdb_iterator *)pfVar5,&pStack_103c,seek_keylen,(byte)iVar4 & 1);
  iVar4 = iVar4 + 1;
  if (iVar4 == 10) goto code_r0x0010768d;
  goto LAB_00107622;
code_r0x0010768d:
  ppfStackY_10a0 = (fdb_doc **)0x107697;
  fdb_iterator_close((fdb_iterator *)pfStack_1090);
  if ((uVar6 & 1) == 0) {
    ppfStackY_10a0 = (fdb_doc **)0x1076a7;
    fdb_kvs_close(pfStack_1080);
  }
  ppfStackY_10a0 = (fdb_doc **)0x1076b1;
  fdb_kvs_close(pfStack_1078);
  uVar6 = uVar6 + 1;
  if (uVar6 == 0x32) {
    ppfStackY_10a0 = (fdb_doc **)0x1076c8;
    fdb_doc_free(pfStack_1088);
    pfStack_1088 = (fdb_doc *)0x0;
    ppfStackY_10a0 = (fdb_doc **)0x1076db;
    fdb_close(pfStack_1070);
    return;
  }
  goto LAB_00107558;
}

Assistant:

void load_replay_kvs(storage_t *st, fdb_kvs_handle *replay_kvs, fdb_seqnum_t seqnum) {

    TEST_INIT();

    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    transaction_t *tx;


    // iterator end at seqnum
    status = fdb_iterator_sequence_init(st->rtx, &it, 0, seqnum,
                                        FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tx = (transaction_t *)rdoc->body;
        if (tx->type == SET_PERSON) {
            status = fdb_set_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len,
                                NULL,0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        if (tx->type == DEL_PERSON) {
            status = fdb_del_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc=NULL;

    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

}